

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToRGB24Row_C(uint8 *src_y,uint8 *src_u,uint8 *src_v,uint8 *rgb_buf,
                     YuvConstants *yuvconstants,int width)

{
  int local_38;
  int x;
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8 *rgb_buf_local;
  uint8 *src_v_local;
  uint8 *src_u_local;
  uint8 *src_y_local;
  
  yuvconstants_local = (YuvConstants *)rgb_buf;
  rgb_buf_local = src_v;
  src_v_local = src_u;
  src_u_local = src_y;
  for (local_38 = 0; local_38 < width + -1; local_38 = local_38 + 2) {
    libyuv::YuvPixel(*src_u_local,*src_v_local,*rgb_buf_local,(uint8 *)yuvconstants_local,
                     (uint8 *)(yuvconstants_local->kUVToB + 1),
                     (uint8 *)(yuvconstants_local->kUVToB + 2),yuvconstants);
    libyuv::YuvPixel(src_u_local[1],*src_v_local,*rgb_buf_local,
                     (uint8 *)(yuvconstants_local->kUVToB + 3),
                     (uint8 *)(yuvconstants_local->kUVToB + 4),
                     (uint8 *)(yuvconstants_local->kUVToB + 5),yuvconstants);
    src_u_local = src_u_local + 2;
    src_v_local = src_v_local + 1;
    rgb_buf_local = rgb_buf_local + 1;
    yuvconstants_local = (YuvConstants *)(yuvconstants_local->kUVToB + 6);
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel(*src_u_local,*src_v_local,*rgb_buf_local,(uint8 *)yuvconstants_local,
                     (uint8 *)(yuvconstants_local->kUVToB + 1),
                     (uint8 *)(yuvconstants_local->kUVToB + 2),yuvconstants);
  }
  return;
}

Assistant:

void I422ToRGB24Row_C(const uint8* src_y,
                      const uint8* src_u,
                      const uint8* src_v,
                      uint8* rgb_buf,
                      const struct YuvConstants* yuvconstants,
                      int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 3, rgb_buf + 4,
             rgb_buf + 5, yuvconstants);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 6;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
  }
}